

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cCullDistanceTests.cpp
# Opt level: O0

IterateResult __thiscall glcts::CullDistance::NegativeTest::iterate(NegativeTest *this)

{
  bool bVar1;
  int iVar2;
  GLuint GVar3;
  deUint32 dVar4;
  RenderContext *pRVar5;
  undefined4 extraout_var;
  ContextInfo *this_00;
  NotSupportedError *this_01;
  TestLog *pTVar6;
  MessageBuilder *pMVar7;
  ostream *poVar8;
  char *pcVar9;
  TestError *pTVar10;
  ulong uVar11;
  string *psVar12;
  GLchar *pGVar13;
  MessageBuilder local_1190;
  string local_1010;
  MessageBuilder local_ff0;
  int local_e6c;
  undefined1 local_e68 [4];
  GLint buffer_size_1;
  MessageBuilder local_e48;
  int local_cc4;
  undefined1 local_cc0 [4];
  GLint link_status;
  string local_b40;
  MessageBuilder local_b20;
  int local_99c;
  undefined8 uStack_998;
  GLint buffer_size;
  char *vs_body_raw_ptr;
  string local_988 [4];
  GLint compile_status_internal;
  string local_968 [8];
  string vs_body_string;
  stringstream vs_body_sstream;
  ostream local_938;
  ulong local_7c0;
  size_t token_position;
  _test_item *current_test_item;
  undefined4 local_7a8;
  uint n_test_item;
  uint n_test_items;
  bool bStack_79c;
  bool bStack_79b;
  _test_item test_items [3];
  GLint compile_status;
  stringstream local_778 [8];
  stringstream temp_sstream_2;
  ostream local_768;
  string local_5f0 [32];
  stringstream local_5d0 [8];
  stringstream temp_sstream_1;
  undefined1 local_5c0 [376];
  string local_448 [32];
  stringstream local_428 [8];
  stringstream temp_sstream;
  undefined1 local_418 [380];
  undefined4 local_29c;
  MessageBuilder local_298;
  string local_118 [8];
  string static_write_shader_body_part;
  string n_gl_culldistance_array_items_string;
  string local_d0 [4];
  GLuint n_gl_culldistance_array_items;
  string n_gl_clipdistance_array_items_string;
  GLuint n_gl_clipdistance_array_items;
  GLint gl_max_cull_distances_value;
  GLint gl_max_combined_clip_and_cull_distances_value;
  GLint gl_max_clip_distances_value;
  allocator<char> local_89;
  string local_88;
  deUint32 local_68;
  ContextType local_64;
  char *local_60;
  GLchar *vs_body_main;
  GLchar *vs_body_preamble;
  GLchar *fs_body;
  GLchar *token_redeclare_output_variables;
  GLchar *token_n_gl_culldistance_entries;
  GLchar *token_n_gl_clipdistance_entries;
  GLchar *token_insert_static_writes;
  GLchar *token_dynamic_index_based_writes;
  Functions *gl;
  NegativeTest *this_local;
  
  gl = (Functions *)this;
  pRVar5 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar2 = (*pRVar5->_vptr_RenderContext[3])();
  token_dynamic_index_based_writes = (GLchar *)CONCAT44(extraout_var,iVar2);
  token_insert_static_writes = "DYNAMIC_INDEX_BASED_WRITES";
  token_n_gl_clipdistance_entries = "INSERT_STATIC_WRITES";
  token_n_gl_culldistance_entries = "N_GL_CLIPDISTANCE_ENTRIES";
  token_redeclare_output_variables = "N_GL_CULLDISTANCE_ENTRIES";
  fs_body = "REDECLARE_OUTPUT_VARIABLES";
  vs_body_preamble = "#version 130\n\nvoid main()\n{\n}\n";
  vs_body_main = "#version 130\n\n    #extension GL_ARB_cull_distance : require\n\n";
  local_60 = 
  "#ifdef REDECLARE_OUTPUT_VARIABLES\n    out float gl_ClipDistance[N_GL_CLIPDISTANCE_ENTRIES];\n    out float gl_CullDistance[N_GL_CULLDISTANCE_ENTRIES];\n#endif\n\nvoid main()\n{\n#ifdef DYNAMIC_INDEX_BASED_WRITES\n    for (int n_clipdistance_entry = 0;\n             n_clipdistance_entry < N_GL_CLIPDISTANCE_ENTRIES;\n           ++n_clipdistance_entry)\n    {\n        gl_ClipDistance[n_clipdistance_entry] = float(n_clipdistance_entry) / float(N_GL_CLIPDISTANCE_ENTRIES);\n    }\n\n    for (int n_culldistance_entry = 0;\n             n_culldistance_entry < N_GL_CULLDISTANCE_ENTRIES;\n           ++n_culldistance_entry)\n    {\n        gl_CullDistance[n_culldistance_entry] = float(n_culldistance_entry) / float(N_GL_CULLDISTANCE_ENTRIES);\n    }\n#else\n    INSERT_STATIC_WRITES\n#endif\n}\n"
  ;
  this_00 = deqp::Context::getContextInfo((this->super_TestCase).m_context);
  bVar1 = glu::ContextInfo::isExtensionSupported(this_00,"GL_ARB_cull_distance");
  if (!bVar1) {
    pRVar5 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
    local_64.super_ApiType.m_bits = (ApiType)(*pRVar5->_vptr_RenderContext[2])();
    local_68 = (deUint32)glu::ApiType::core(4,5);
    bVar1 = glu::contextSupports(local_64,(ApiType)local_68);
    if (!bVar1) {
      gl_max_combined_clip_and_cull_distances_value._3_1_ = 1;
      this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_88,"GL_ARB_cull_distance is not supported",&local_89);
      tcu::NotSupportedError::NotSupportedError(this_01,&local_88);
      gl_max_combined_clip_and_cull_distances_value._3_1_ = 0;
      __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,
                  tcu::NotSupportedError::~NotSupportedError);
    }
  }
  gl_max_cull_distances_value = 0;
  n_gl_clipdistance_array_items = 0;
  n_gl_clipdistance_array_items_string.field_2._12_4_ = 0;
  n_gl_clipdistance_array_items_string.field_2._8_4_ = 0;
  std::__cxx11::string::string(local_d0);
  std::__cxx11::string::string((string *)(static_write_shader_body_part.field_2._M_local_buf + 8));
  std::__cxx11::string::string(local_118);
  (**(code **)(token_dynamic_index_based_writes + 0x868))(0xd32,&gl_max_cull_distances_value);
  (**(code **)(token_dynamic_index_based_writes + 0x868))(0x82fa,&n_gl_clipdistance_array_items);
  (**(code **)(token_dynamic_index_based_writes + 0x868))
            (0x82f9,(undefined1 *)((long)&n_gl_clipdistance_array_items_string.field_2 + 0xc));
  if (gl_max_cull_distances_value + n_gl_clipdistance_array_items_string.field_2._12_4_ <
      (int)n_gl_clipdistance_array_items) {
    pTVar6 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_298,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar7 = tcu::MessageBuilder::operator<<
                       (&local_298,
                        (char (*) [137])
                        "GL_MAX_COMBINED_CLIP_AND_CULL_DISTANCES is larger than or equal to the sum of GL_MAX_CLIP_DISTANCES and GL_MAX_CULL_DISTANCES. Skipping."
                       );
    tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_298);
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
               "Pass");
  }
  else {
    n_gl_clipdistance_array_items_string.field_2._8_4_ = gl_max_cull_distances_value;
    iVar2 = n_gl_clipdistance_array_items - gl_max_cull_distances_value;
    std::__cxx11::stringstream::stringstream(local_428);
    std::ostream::operator<<(local_418,n_gl_clipdistance_array_items_string.field_2._8_4_);
    std::__cxx11::stringstream::str();
    std::__cxx11::string::operator=(local_d0,local_448);
    std::__cxx11::string::~string(local_448);
    std::__cxx11::stringstream::~stringstream(local_428);
    std::__cxx11::stringstream::stringstream(local_5d0);
    std::ostream::operator<<(local_5c0,iVar2 + 1);
    std::__cxx11::stringstream::str();
    std::__cxx11::string::operator=
              ((string *)(static_write_shader_body_part.field_2._M_local_buf + 8),local_5f0);
    std::__cxx11::string::~string(local_5f0);
    std::__cxx11::stringstream::~stringstream(local_5d0);
    std::__cxx11::stringstream::stringstream(local_778);
    poVar8 = std::operator<<(&local_768,"gl_ClipDistance[");
    pcVar9 = (char *)std::__cxx11::string::c_str();
    poVar8 = std::operator<<(poVar8,pcVar9);
    poVar8 = std::operator<<(poVar8,"] = 0.0f;\n");
    poVar8 = std::operator<<(poVar8,"gl_CullDistance[");
    pcVar9 = (char *)std::__cxx11::string::c_str();
    poVar8 = std::operator<<(poVar8,pcVar9);
    std::operator<<(poVar8,"] = 0.0f;\n");
    std::__cxx11::stringstream::str();
    std::__cxx11::string::operator=(local_118,(string *)(test_items + 1));
    std::__cxx11::string::~string((string *)(test_items + 1));
    std::__cxx11::stringstream::~stringstream(local_778);
    bStack_79c = false;
    bStack_79b = false;
    test_items[0].should_redeclare_output_variables = false;
    test_items[0].use_dynamic_index_based_writes = false;
    GVar3 = (**(code **)(token_dynamic_index_based_writes + 0x3f0))(0x8b30);
    this->m_fs_id = GVar3;
    GVar3 = (**(code **)(token_dynamic_index_based_writes + 0x3c8))();
    this->m_po_id = GVar3;
    GVar3 = (**(code **)(token_dynamic_index_based_writes + 0x3f0))(0x8b31);
    this->m_vs_id = GVar3;
    dVar4 = (**(code **)(token_dynamic_index_based_writes + 0x800))();
    glu::checkError(dVar4,"glCreateProgram() / glCreateShader() calls failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                    ,0xc0c);
    (**(code **)(token_dynamic_index_based_writes + 0x10))(this->m_po_id,this->m_fs_id);
    (**(code **)(token_dynamic_index_based_writes + 0x10))(this->m_po_id,this->m_vs_id);
    dVar4 = (**(code **)(token_dynamic_index_based_writes + 0x800))();
    glu::checkError(dVar4,"glAttachShader() call(s) failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                    ,0xc11);
    (**(code **)(token_dynamic_index_based_writes + 0x12b8))(this->m_fs_id,1,&vs_body_preamble,0);
    dVar4 = (**(code **)(token_dynamic_index_based_writes + 0x800))();
    glu::checkError(dVar4,"glShaderSource() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                    ,0xc15);
    (**(code **)(token_dynamic_index_based_writes + 0x248))(this->m_fs_id);
    dVar4 = (**(code **)(token_dynamic_index_based_writes + 0x800))();
    glu::checkError(dVar4,"glCompileShader() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                    ,0xc18);
    (**(code **)(token_dynamic_index_based_writes + 0xa70))
              (this->m_fs_id,0x8b81,&stack0xfffffffffffff864);
    dVar4 = (**(code **)(token_dynamic_index_based_writes + 0x800))();
    glu::checkError(dVar4,"glGetShaderiv() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                    ,0xc1b);
    if (_bStack_79c == 0) {
      pTVar10 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar10,"Fragment shader failed to compile.",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                 ,0xc1f);
      __cxa_throw(pTVar10,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    stack0xfffffffffffff85e = 1;
    n_test_items._2_2_ = 0x100;
    local_7a8 = 3;
    for (current_test_item._4_4_ = 0; current_test_item._4_4_ < 3;
        current_test_item._4_4_ = current_test_item._4_4_ + 1) {
      token_position = (long)&n_test_item + (ulong)current_test_item._4_4_ * 2 + 2;
      local_7c0 = 0xffffffffffffffff;
      std::__cxx11::stringstream::stringstream
                ((stringstream *)(vs_body_string.field_2._M_local_buf + 8));
      std::__cxx11::string::string(local_968);
      poVar8 = std::operator<<(&local_938,vs_body_main);
      std::operator<<(poVar8,"\n");
      if ((*(byte *)token_position & 1) != 0) {
        poVar8 = std::operator<<(&local_938,"#define ");
        poVar8 = std::operator<<(poVar8,fs_body);
        std::operator<<(poVar8,"\n");
      }
      if ((*(byte *)(token_position + 1) & 1) != 0) {
        poVar8 = std::operator<<(&local_938,"#define ");
        poVar8 = std::operator<<(poVar8,token_insert_static_writes);
        std::operator<<(poVar8,"\n");
      }
      std::operator<<(&local_938,local_60);
      std::__cxx11::stringstream::str();
      std::__cxx11::string::operator=(local_968,local_988);
      std::__cxx11::string::~string(local_988);
      while (uVar11 = std::__cxx11::string::find
                                ((char *)local_968,(ulong)token_n_gl_culldistance_entries),
            uVar11 != 0xffffffffffffffff) {
        local_7c0 = uVar11;
        psVar12 = (string *)strlen(token_n_gl_culldistance_entries);
        psVar12 = (string *)std::__cxx11::string::replace((ulong)local_968,uVar11,psVar12);
        std::__cxx11::string::operator=(local_968,psVar12);
      }
      local_7c0 = 0xffffffffffffffff;
      while (uVar11 = std::__cxx11::string::find
                                ((char *)local_968,(ulong)token_redeclare_output_variables),
            uVar11 != 0xffffffffffffffff) {
        local_7c0 = uVar11;
        psVar12 = (string *)strlen(token_n_gl_culldistance_entries);
        psVar12 = (string *)std::__cxx11::string::replace((ulong)local_968,uVar11,psVar12);
        std::__cxx11::string::operator=(local_968,psVar12);
      }
      local_7c0 = 0xffffffffffffffff;
      while (uVar11 = std::__cxx11::string::find
                                ((char *)local_968,(ulong)token_n_gl_clipdistance_entries),
            local_7c0 = uVar11, uVar11 != 0xffffffffffffffff) {
        psVar12 = (string *)strlen(token_n_gl_clipdistance_entries);
        psVar12 = (string *)std::__cxx11::string::replace((ulong)local_968,uVar11,psVar12);
        std::__cxx11::string::operator=(local_968,psVar12);
      }
      vs_body_raw_ptr._4_4_ = 0;
      uStack_998 = std::__cxx11::string::c_str();
      (**(code **)(token_dynamic_index_based_writes + 0x12b8))
                (this->m_vs_id,1,&stack0xfffffffffffff668,0);
      dVar4 = (**(code **)(token_dynamic_index_based_writes + 0x800))();
      glu::checkError(dVar4,"glShaderSource() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                      ,0xc64);
      (**(code **)(token_dynamic_index_based_writes + 0x248))(this->m_vs_id);
      dVar4 = (**(code **)(token_dynamic_index_based_writes + 0x800))();
      glu::checkError(dVar4,"glCompileShader() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                      ,0xc67);
      (**(code **)(token_dynamic_index_based_writes + 0xa70))
                (this->m_vs_id,0x8b81,(long)&vs_body_raw_ptr + 4);
      dVar4 = (**(code **)(token_dynamic_index_based_writes + 0x800))();
      glu::checkError(dVar4,"glGetShaderiv() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                      ,0xc6a);
      if (vs_body_raw_ptr._4_4_ == 0) {
        local_99c = 0;
        pTVar6 = tcu::TestContext::getLog
                           ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
        tcu::TestLog::operator<<(&local_b20,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
        getTestDescription_abi_cxx11_
                  (&local_b40,this,current_test_item._4_4_,(bool)(*(byte *)token_position & 1),
                   (bool)(*(byte *)(token_position + 1) & 1));
        pMVar7 = tcu::MessageBuilder::operator<<(&local_b20,&local_b40);
        pMVar7 = tcu::MessageBuilder::operator<<
                           (pMVar7,(char (*) [67])
                                   "has failed (as expected) to compile with the following info log:\n\n"
                           );
        tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::string::~string((string *)&local_b40);
        tcu::MessageBuilder::~MessageBuilder(&local_b20);
        (**(code **)(token_dynamic_index_based_writes + 0xa70))(this->m_vs_id,0x8b84,&local_99c);
        dVar4 = (**(code **)(token_dynamic_index_based_writes + 0x800))();
        glu::checkError(dVar4,"glGetShaderiv() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                        ,0xc78);
        pGVar13 = (GLchar *)operator_new__((long)(local_99c + 1));
        this->m_temp_buffer = pGVar13;
        memset(this->m_temp_buffer,0,(long)(local_99c + 1));
        (**(code **)(token_dynamic_index_based_writes + 0xa58))
                  (this->m_vs_id,local_99c,0,this->m_temp_buffer);
        dVar4 = (**(code **)(token_dynamic_index_based_writes + 0x800))();
        glu::checkError(dVar4,"glGetShaderInfoLog() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                        ,0xc80);
        pTVar6 = tcu::TestContext::getLog
                           ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
        tcu::TestLog::operator<<
                  ((MessageBuilder *)local_cc0,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar7 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_cc0,&this->m_temp_buffer);
        tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_cc0);
        if (this->m_temp_buffer != (GLchar *)0x0) {
          operator_delete__(this->m_temp_buffer);
        }
        this->m_temp_buffer = (GLchar *)0x0;
        local_29c = 4;
      }
      else {
        local_cc4 = 0;
        (**(code **)(token_dynamic_index_based_writes + 0xce8))(this->m_po_id);
        dVar4 = (**(code **)(token_dynamic_index_based_writes + 0x800))();
        glu::checkError(dVar4,"glLinkProgram() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                        ,0xc8f);
        (**(code **)(token_dynamic_index_based_writes + 0x9d8))(this->m_po_id,0x8b82,&local_cc4);
        dVar4 = (**(code **)(token_dynamic_index_based_writes + 0x800))();
        glu::checkError(dVar4,"glGetProgramiv() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                        ,0xc92);
        if (local_cc4 == 1) {
          pTVar6 = tcu::TestContext::getLog
                             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
          tcu::TestLog::operator<<(&local_e48,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
          getTestDescription_abi_cxx11_
                    ((string *)local_e68,this,current_test_item._4_4_,
                     (bool)(*(byte *)token_position & 1),(bool)(*(byte *)(token_position + 1) & 1));
          pMVar7 = tcu::MessageBuilder::operator<<
                             (&local_e48,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_e68);
          pMVar7 = tcu::MessageBuilder::operator<<
                             (pMVar7,(char (*) [42])"has linked successfully which is invalid!");
          tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::string::~string((string *)local_e68);
          tcu::MessageBuilder::~MessageBuilder(&local_e48);
          pTVar10 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar10,
                     "Program object has linked successfully, even though the process should have failed."
                     ,(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                     ,0xc9b);
          __cxa_throw(pTVar10,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
        }
        local_e6c = 0;
        pTVar6 = tcu::TestContext::getLog
                           ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
        tcu::TestLog::operator<<(&local_ff0,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
        getTestDescription_abi_cxx11_
                  (&local_1010,this,current_test_item._4_4_,(bool)(*(byte *)token_position & 1),
                   (bool)(*(byte *)(token_position + 1) & 1));
        pMVar7 = tcu::MessageBuilder::operator<<(&local_ff0,&local_1010);
        pMVar7 = tcu::MessageBuilder::operator<<
                           (pMVar7,(char (*) [64])
                                   "has failed (as expected) to link with the following info log:\n\n"
                           );
        tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::string::~string((string *)&local_1010);
        tcu::MessageBuilder::~MessageBuilder(&local_ff0);
        (**(code **)(token_dynamic_index_based_writes + 0x9d8))(this->m_po_id,0x8b84,&local_e6c);
        dVar4 = (**(code **)(token_dynamic_index_based_writes + 0x800))();
        glu::checkError(dVar4,"glGetProgramiv() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                        ,0xca8);
        pGVar13 = (GLchar *)operator_new__((long)(local_e6c + 1));
        this->m_temp_buffer = pGVar13;
        memset(this->m_temp_buffer,0,(long)(local_e6c + 1));
        (**(code **)(token_dynamic_index_based_writes + 0x988))
                  (this->m_po_id,local_e6c,0,this->m_temp_buffer);
        dVar4 = (**(code **)(token_dynamic_index_based_writes + 0x800))();
        glu::checkError(dVar4,"glGetProgramInfoLog() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                        ,0xcb0);
        pTVar6 = tcu::TestContext::getLog
                           ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
        tcu::TestLog::operator<<(&local_1190,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar7 = tcu::MessageBuilder::operator<<(&local_1190,&this->m_temp_buffer);
        tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_1190);
        if (this->m_temp_buffer != (GLchar *)0x0) {
          operator_delete__(this->m_temp_buffer);
        }
        this->m_temp_buffer = (GLchar *)0x0;
        local_29c = 0;
      }
      std::__cxx11::string::~string(local_968);
      std::__cxx11::stringstream::~stringstream
                ((stringstream *)(vs_body_string.field_2._M_local_buf + 8));
    }
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
               "Pass");
  }
  this_local._4_4_ = STOP;
  local_29c = 1;
  std::__cxx11::string::~string(local_118);
  std::__cxx11::string::~string((string *)(static_write_shader_body_part.field_2._M_local_buf + 8));
  std::__cxx11::string::~string(local_d0);
  return this_local._4_4_;
}

Assistant:

tcu::TestNode::IterateResult CullDistance::NegativeTest::iterate()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Build the test shaders. */
	const glw::GLchar* token_dynamic_index_based_writes = "DYNAMIC_INDEX_BASED_WRITES";
	const glw::GLchar* token_insert_static_writes		= "INSERT_STATIC_WRITES";
	const glw::GLchar* token_n_gl_clipdistance_entries  = "N_GL_CLIPDISTANCE_ENTRIES";
	const glw::GLchar* token_n_gl_culldistance_entries  = "N_GL_CULLDISTANCE_ENTRIES";
	const glw::GLchar* token_redeclare_output_variables = "REDECLARE_OUTPUT_VARIABLES";

	const glw::GLchar* fs_body = "#version 130\n"
								 "\n"
								 "void main()\n"
								 "{\n"
								 "}\n";

	const glw::GLchar* vs_body_preamble = "#version 130\n"
										  "\n"
										  "    #extension GL_ARB_cull_distance : require\n"
										  "\n";

	const glw::GLchar* vs_body_main = "#ifdef REDECLARE_OUTPUT_VARIABLES\n"
									  "    out float gl_ClipDistance[N_GL_CLIPDISTANCE_ENTRIES];\n"
									  "    out float gl_CullDistance[N_GL_CULLDISTANCE_ENTRIES];\n"
									  "#endif\n"
									  "\n"
									  "void main()\n"
									  "{\n"
									  "#ifdef DYNAMIC_INDEX_BASED_WRITES\n"
									  "    for (int n_clipdistance_entry = 0;\n"
									  "             n_clipdistance_entry < N_GL_CLIPDISTANCE_ENTRIES;\n"
									  "           ++n_clipdistance_entry)\n"
									  "    {\n"
									  "        gl_ClipDistance[n_clipdistance_entry] = float(n_clipdistance_entry) / "
									  "float(N_GL_CLIPDISTANCE_ENTRIES);\n"
									  "    }\n"
									  "\n"
									  "    for (int n_culldistance_entry = 0;\n"
									  "             n_culldistance_entry < N_GL_CULLDISTANCE_ENTRIES;\n"
									  "           ++n_culldistance_entry)\n"
									  "    {\n"
									  "        gl_CullDistance[n_culldistance_entry] = float(n_culldistance_entry) / "
									  "float(N_GL_CULLDISTANCE_ENTRIES);\n"
									  "    }\n"
									  "#else\n"
									  "    INSERT_STATIC_WRITES\n"
									  "#endif\n"
									  "}\n";

	/* This test should only be executed if ARB_cull_distance is supported, or if
	 * we're running a GL4.5 context
	 */
	if (!m_context.getContextInfo().isExtensionSupported("GL_ARB_cull_distance") &&
		!glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(4, 5)))
	{
		throw tcu::NotSupportedError("GL_ARB_cull_distance is not supported");
	}

	/* It only makes sense to run this test if GL_MAX_COMBINED_CLIP_AND_CULL_DISTANCES
	 * is lower than a sum of GL_MAX_CLIP_DISTANCES and GL_MAX_CLIP_CULL_DISTANCES.
	 */
	glw::GLint  gl_max_clip_distances_value					  = 0;
	glw::GLint  gl_max_combined_clip_and_cull_distances_value = 0;
	glw::GLint  gl_max_cull_distances_value					  = 0;
	glw::GLuint n_gl_clipdistance_array_items				  = 0;
	std::string n_gl_clipdistance_array_items_string;
	glw::GLuint n_gl_culldistance_array_items = 0;
	std::string n_gl_culldistance_array_items_string;
	std::string static_write_shader_body_part;

	gl.getIntegerv(GL_MAX_CLIP_DISTANCES, &gl_max_clip_distances_value);
	gl.getIntegerv(GL_MAX_COMBINED_CLIP_AND_CULL_DISTANCES, &gl_max_combined_clip_and_cull_distances_value);
	gl.getIntegerv(GL_MAX_CULL_DISTANCES, &gl_max_cull_distances_value);

	if (gl_max_clip_distances_value + gl_max_cull_distances_value < gl_max_combined_clip_and_cull_distances_value)
	{
		m_testCtx.getLog() << tcu::TestLog::Message
						   << "GL_MAX_COMBINED_CLIP_AND_CULL_DISTANCES is larger than or equal to "
							  "the sum of GL_MAX_CLIP_DISTANCES and GL_MAX_CULL_DISTANCES. Skipping."
						   << tcu::TestLog::EndMessage;

		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

		return STOP;
	}

	n_gl_clipdistance_array_items = gl_max_clip_distances_value;
	n_gl_culldistance_array_items = gl_max_combined_clip_and_cull_distances_value - gl_max_clip_distances_value + 1;

	/* Determine the number of items we will want the gl_ClipDistance and gl_CullDistance arrays
	 * to hold for test iterations that will re-declare the built-in output variables.
	 */
	{
		std::stringstream temp_sstream;

		temp_sstream << n_gl_clipdistance_array_items;

		n_gl_clipdistance_array_items_string = temp_sstream.str();
	}

	{
		std::stringstream temp_sstream;

		temp_sstream << n_gl_culldistance_array_items;

		n_gl_culldistance_array_items_string = temp_sstream.str();
	}

	/* Form the "static write" shader body part. */
	{
		std::stringstream temp_sstream;

		temp_sstream << "gl_ClipDistance[" << n_gl_clipdistance_array_items_string.c_str() << "] = 0.0f;\n"
					 << "gl_CullDistance[" << n_gl_culldistance_array_items_string.c_str() << "] = 0.0f;\n";

		static_write_shader_body_part = temp_sstream.str();
	}

	/* Prepare GL objects before we continue */
	glw::GLint compile_status = GL_FALSE;

	m_fs_id = gl.createShader(GL_FRAGMENT_SHADER);
	m_po_id = gl.createProgram();
	m_vs_id = gl.createShader(GL_VERTEX_SHADER);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateProgram() / glCreateShader() calls failed.");

	gl.attachShader(m_po_id, m_fs_id);
	gl.attachShader(m_po_id, m_vs_id);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glAttachShader() call(s) failed.");

	gl.shaderSource(m_fs_id, 1,			/* count */
					&fs_body, DE_NULL); /* length */
	GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource() call failed.");

	gl.compileShader(m_fs_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCompileShader() call failed.");

	gl.getShaderiv(m_fs_id, GL_COMPILE_STATUS, &compile_status);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetShaderiv() call failed.");

	if (compile_status == GL_FALSE)
	{
		TCU_FAIL("Fragment shader failed to compile.");
	}

	/* Run three separate test iterations. */
	struct _test_item
	{
		bool should_redeclare_output_variables;
		bool use_dynamic_index_based_writes;
	} test_items[] = { /* Negative Test 1 */
					   { true, false },

					   /* Negative Test 2 */
					   { false, false },

					   /* Negative Test 3 */
					   { false, true }
	};
	const unsigned int n_test_items = sizeof(test_items) / sizeof(test_items[0]);

	for (unsigned int n_test_item = 0; n_test_item < n_test_items; ++n_test_item)
	{
		const _test_item& current_test_item = test_items[n_test_item];

		/* Prepare vertex shader body */
		std::size_t		  token_position = std::string::npos;
		std::stringstream vs_body_sstream;
		std::string		  vs_body_string;

		vs_body_sstream << vs_body_preamble << "\n";

		if (current_test_item.should_redeclare_output_variables)
		{
			vs_body_sstream << "#define " << token_redeclare_output_variables << "\n";
		}

		if (current_test_item.use_dynamic_index_based_writes)
		{
			vs_body_sstream << "#define " << token_dynamic_index_based_writes << "\n";
		}

		vs_body_sstream << vs_body_main;

		/* Replace tokens with meaningful values */
		vs_body_string = vs_body_sstream.str();

		while ((token_position = vs_body_string.find(token_n_gl_clipdistance_entries)) != std::string::npos)
		{
			vs_body_string = vs_body_string.replace(token_position, strlen(token_n_gl_clipdistance_entries),
													n_gl_clipdistance_array_items_string);
		}

		while ((token_position = vs_body_string.find(token_n_gl_culldistance_entries)) != std::string::npos)
		{
			vs_body_string = vs_body_string.replace(token_position, strlen(token_n_gl_clipdistance_entries),
													n_gl_culldistance_array_items_string);
		}

		while ((token_position = vs_body_string.find(token_insert_static_writes)) != std::string::npos)
		{
			vs_body_string = vs_body_string.replace(token_position, strlen(token_insert_static_writes),
													static_write_shader_body_part);
		}

		/* Try to compile the vertex shader */
		glw::GLint  compile_status_internal = GL_FALSE;
		const char* vs_body_raw_ptr			= vs_body_string.c_str();

		gl.shaderSource(m_vs_id, 1,					/* count */
						&vs_body_raw_ptr, DE_NULL); /* length */
		GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource() call failed.");

		gl.compileShader(m_vs_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCompileShader() call failed.");

		gl.getShaderiv(m_vs_id, GL_COMPILE_STATUS, &compile_status_internal);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetShaderiv() call failed.");

		if (compile_status_internal == GL_FALSE)
		{
			glw::GLint buffer_size = 0;

			/* Log the compilation error */
			m_testCtx.getLog() << tcu::TestLog::Message
							   << getTestDescription(n_test_item, current_test_item.should_redeclare_output_variables,
													 current_test_item.use_dynamic_index_based_writes)
							   << "has failed (as expected) to compile with the following info log:\n\n"
							   << tcu::TestLog::EndMessage;

			gl.getShaderiv(m_vs_id, GL_INFO_LOG_LENGTH, &buffer_size);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glGetShaderiv() call failed.");

			m_temp_buffer = new glw::GLchar[buffer_size + 1];

			memset(m_temp_buffer, 0, buffer_size + 1);

			gl.getShaderInfoLog(m_vs_id, buffer_size, DE_NULL, /* length */
								m_temp_buffer);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glGetShaderInfoLog() call failed.");

			m_testCtx.getLog() << tcu::TestLog::Message << m_temp_buffer << tcu::TestLog::EndMessage;

			delete[] m_temp_buffer;
			m_temp_buffer = DE_NULL;

			/* Move on to the next iteration */
			continue;
		}

		/* Try to link the program object */
		glw::GLint link_status = GL_FALSE;

		gl.linkProgram(m_po_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glLinkProgram() call failed.");

		gl.getProgramiv(m_po_id, GL_LINK_STATUS, &link_status);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramiv() call failed.");

		if (link_status == GL_TRUE)
		{
			m_testCtx.getLog() << tcu::TestLog::Message
							   << getTestDescription(n_test_item, current_test_item.should_redeclare_output_variables,
													 current_test_item.use_dynamic_index_based_writes)
							   << "has linked successfully which is invalid!" << tcu::TestLog::EndMessage;

			TCU_FAIL("Program object has linked successfully, even though the process should have failed.");
		}
		else
		{
			glw::GLint buffer_size = 0;

			m_testCtx.getLog() << tcu::TestLog::Message
							   << getTestDescription(n_test_item, current_test_item.should_redeclare_output_variables,
													 current_test_item.use_dynamic_index_based_writes)
							   << "has failed (as expected) to link with the following info log:\n\n"
							   << tcu::TestLog::EndMessage;

			gl.getProgramiv(m_po_id, GL_INFO_LOG_LENGTH, &buffer_size);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramiv() call failed.");

			m_temp_buffer = new glw::GLchar[buffer_size + 1];

			memset(m_temp_buffer, 0, buffer_size + 1);

			gl.getProgramInfoLog(m_po_id, buffer_size, DE_NULL, /* length */
								 m_temp_buffer);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramInfoLog() call failed.");

			m_testCtx.getLog() << tcu::TestLog::Message << m_temp_buffer << tcu::TestLog::EndMessage;

			delete[] m_temp_buffer;
			m_temp_buffer = DE_NULL;
		}
	} /* for (all test items) */

	/* All done */
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	return STOP;
}